

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# face.c
# Opt level: O2

bool_t prf_face_load_f(prf_node_t *node,prf_state_t *state,bfile_t *bfile)

{
  pool_t pool_id;
  uint uVar1;
  uint8_t uVar2;
  uint16_t uVar3;
  int16_t iVar4;
  ushort uVar5;
  int32_t iVar6;
  uint32_t uVar7;
  uint8_t *buffer;
  uint len;
  bool_t bVar8;
  
  uVar3 = bf_get_uint16_be(bfile);
  node->opcode = uVar3;
  uVar3 = bf_get_uint16_be(bfile);
  node->length = uVar3;
  if (uVar3 < 0x2c) {
    prf_error(3,"face node too short (only %d bytes)");
LAB_001053da:
    bVar8 = 0;
    bf_rewind(bfile,4);
  }
  else {
    buffer = node->data;
    if (buffer == (uint8_t *)0x0) {
      pool_id = state->model->mempool_id;
      if (pool_id == 0) {
        buffer = (uint8_t *)malloc((ulong)(uVar3 - 4));
      }
      else {
        buffer = (uint8_t *)pool_malloc(pool_id,uVar3 - 4);
      }
      node->data = buffer;
      if (buffer == (uint8_t *)0x0) {
        prf_error(9,"memory allocation problem (returned NULL)");
        goto LAB_001053da;
      }
    }
    bf_read(bfile,buffer,8);
    iVar6 = bf_get_int32_be(bfile);
    *(int32_t *)(buffer + 8) = iVar6;
    iVar4 = bf_get_int16_be(bfile);
    *(int16_t *)(buffer + 0xc) = iVar4;
    uVar2 = bf_get_int8(bfile);
    buffer[0xe] = uVar2;
    uVar2 = bf_get_int8(bfile);
    buffer[0xf] = uVar2;
    uVar3 = bf_get_uint16_be(bfile);
    *(uint16_t *)(buffer + 0x10) = uVar3;
    uVar3 = bf_get_uint16_be(bfile);
    *(uint16_t *)(buffer + 0x12) = uVar3;
    uVar2 = bf_get_int8(bfile);
    buffer[0x14] = uVar2;
    uVar2 = bf_get_int8(bfile);
    buffer[0x15] = uVar2;
    iVar4 = bf_get_int16_be(bfile);
    *(int16_t *)(buffer + 0x16) = iVar4;
    iVar4 = bf_get_int16_be(bfile);
    *(int16_t *)(buffer + 0x18) = iVar4;
    iVar4 = bf_get_int16_be(bfile);
    *(int16_t *)(buffer + 0x1a) = iVar4;
    iVar4 = bf_get_int16_be(bfile);
    *(int16_t *)(buffer + 0x1c) = iVar4;
    iVar4 = bf_get_int16_be(bfile);
    *(int16_t *)(buffer + 0x1e) = iVar4;
    iVar6 = bf_get_int32_be(bfile);
    *(int32_t *)(buffer + 0x20) = iVar6;
    uVar3 = bf_get_uint16_be(bfile);
    *(uint16_t *)(buffer + 0x24) = uVar3;
    uVar2 = bf_get_uint8(bfile);
    buffer[0x26] = uVar2;
    uVar2 = bf_get_uint8(bfile);
    buffer[0x27] = uVar2;
    uVar5 = node->length;
    if (uVar5 < 0x30) {
      uVar1 = 0x2c;
    }
    else {
      uVar7 = bf_get_uint32_be(bfile);
      *(uint32_t *)(buffer + 0x28) = uVar7;
      uVar5 = node->length;
      if (uVar5 < 0x31) {
        uVar1 = 0x30;
      }
      else {
        uVar2 = bf_get_uint8(bfile);
        buffer[0x2c] = uVar2;
        uVar5 = node->length;
        if (uVar5 < 0x32) {
          uVar1 = 0x31;
        }
        else {
          uVar2 = bf_get_uint8(bfile);
          buffer[0x2d] = uVar2;
          uVar5 = node->length;
          if (uVar5 < 0x34) {
            uVar1 = 0x32;
          }
          else {
            uVar3 = bf_get_uint16_be(bfile);
            *(uint16_t *)(buffer + 0x2e) = uVar3;
            uVar5 = node->length;
            if (uVar5 < 0x38) {
              uVar1 = 0x34;
            }
            else {
              uVar7 = bf_get_uint32_be(bfile);
              *(uint32_t *)(buffer + 0x30) = uVar7;
              uVar5 = node->length;
              if (uVar5 < 0x3c) {
                uVar1 = 0x38;
              }
              else {
                uVar7 = bf_get_uint32_be(bfile);
                *(uint32_t *)(buffer + 0x34) = uVar7;
                uVar5 = node->length;
                if (uVar5 < 0x40) {
                  uVar1 = 0x3c;
                }
                else {
                  uVar7 = bf_get_uint32_be(bfile);
                  *(uint32_t *)(buffer + 0x38) = uVar7;
                  uVar5 = node->length;
                  if (uVar5 < 0x42) {
                    uVar1 = 0x40;
                  }
                  else {
                    iVar4 = bf_get_int16_be(bfile);
                    *(int16_t *)(buffer + 0x3c) = iVar4;
                    uVar5 = node->length;
                    if (uVar5 < 0x44) {
                      uVar1 = 0x42;
                    }
                    else {
                      iVar4 = bf_get_int16_be(bfile);
                      *(int16_t *)(buffer + 0x3e) = iVar4;
                      uVar5 = node->length;
                      if (uVar5 < 0x48) {
                        uVar1 = 0x44;
                      }
                      else {
                        uVar7 = bf_get_uint32_be(bfile);
                        *(uint32_t *)(buffer + 0x40) = uVar7;
                        uVar5 = node->length;
                        if (uVar5 < 0x4c) {
                          uVar1 = 0x48;
                        }
                        else {
                          uVar7 = bf_get_uint32_be(bfile);
                          *(uint32_t *)(buffer + 0x44) = uVar7;
                          uVar5 = node->length;
                          if (uVar5 < 0x4e) {
                            uVar1 = 0x4c;
                          }
                          else {
                            iVar4 = bf_get_int16_be(bfile);
                            *(int16_t *)(buffer + 0x48) = iVar4;
                            uVar5 = node->length;
                            if (uVar5 < 0x50) {
                              uVar1 = 0x4e;
                            }
                            else {
                              iVar4 = bf_get_int16_be(bfile);
                              *(int16_t *)(buffer + 0x4a) = iVar4;
                              uVar5 = node->length;
                              uVar1 = 0x50;
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
    bVar8 = 1;
    len = uVar5 - uVar1;
    if (uVar1 <= uVar5 && len != 0) {
      bf_read(bfile,node->data + ((ulong)uVar1 - 4),len);
    }
  }
  return bVar8;
}

Assistant:

static
bool_t
prf_face_load_f(
    prf_node_t * node,
    prf_state_t * state,
    bfile_t * bfile )
{
    int pos;

    assert( node != NULL && state != NULL && bfile != NULL );
 
    node->opcode = bf_get_uint16_be( bfile );
    assert( node->opcode == prf_face_info.opcode );

    node->length = bf_get_uint16_be( bfile );
    if ( node->length < 44 ) {
        prf_error( 3, "face node too short (only %d bytes)", node->length );
        bf_rewind( bfile, 4 );
        return FALSE;
    }

    if ( node->length > 4 && node->data == NULL ) { /* not pre-allocated */
        assert( state->model != NULL );
        if ( state->model->mempool_id == 0 )
            node->data = (uint8_t *)malloc( node->length - 4 + NODE_DATA_PAD );
        else
            node->data = (uint8_t *)pool_malloc( state->model->mempool_id,
                node->length - 4 + NODE_DATA_PAD );
        if ( node->data == NULL ) {
            prf_error( 9, "memory allocation problem (returned NULL)" );
            bf_rewind( bfile, 4 );
            return FALSE;
        }
    }

    pos = 4;
    do {
        node_data * data;
        data = (node_data *) node->data;

        bf_read( bfile, (uint8_t *) data->ascii_id, 8 ); pos += 8;
        data->ir_color_code = bf_get_int32_be( bfile ); pos += 4;
        data->relative_priority = bf_get_int16_be( bfile ); pos += 2;
        data->draw_type = bf_get_int8( bfile ); pos += 1;
        data->texture_white = bf_get_int8( bfile ); pos += 1;
        data->color_name_index = bf_get_uint16_be( bfile ); pos += 2;
        data->alternate_color_name_index = bf_get_uint16_be( bfile ); pos += 2;
        data->reserved1 = bf_get_int8( bfile ); pos += 1;
        data->billboard_flags = bf_get_int8( bfile ); pos += 1;
        data->detail_texture_pattern_index = bf_get_int16_be( bfile ); pos += 2;
        data->texture_pattern_index = bf_get_int16_be( bfile ); pos += 2;
        data->material_index = bf_get_int16_be( bfile ); pos += 2;
        data->surface_material_code = bf_get_int16_be( bfile ); pos += 2;
        data->feature_id = bf_get_int16_be( bfile ); pos += 2;
        data->ir_material_code = bf_get_int32_be( bfile ); pos += 4;
        data->transparency = bf_get_uint16_be( bfile ); pos += 2;
        data->lod_generation_control = bf_get_uint8( bfile ); pos += 1;
        data->line_style_index = bf_get_uint8( bfile ); pos += 1;
        if ( node->length < (pos + 4) ) break;
        data->flags = bf_get_uint32_be( bfile ); pos += 4;
        if ( node->length < (pos + 1) ) break;
        data->light_mode = bf_get_uint8( bfile ); pos += 1;
        if ( node->length < (pos + 1) ) break;
        data->reserved2 = bf_get_uint8( bfile ); pos += 1;
        if ( node->length < (pos + 2) ) break;
        data->reserved3 = bf_get_uint16_be( bfile ); pos += 2;
        if ( node->length < (pos + 4) ) break;
        data->reserved4 = bf_get_uint32_be( bfile ); pos += 4;
        if ( node->length < (pos + 4) ) break;
        data->packed_color_primary = bf_get_uint32_be( bfile ); pos += 4;
        if ( node->length < (pos + 4) ) break;
        data->packed_color_alternate = bf_get_uint32_be( bfile ); pos += 4;
        if ( node->length < (pos + 2) ) break;
        data->texture_mapping_index = bf_get_int16_be( bfile ); pos += 2;
        if ( node->length < (pos + 2) ) break;
        data->reserved5 = bf_get_int16_be( bfile ); pos += 2;
        if ( node->length < (pos + 4) ) break;
        data->primary_color_index = bf_get_uint32_be( bfile ); pos += 4;
        if ( node->length < (pos + 4) ) break;
        data->alternate_color_index = bf_get_uint32_be( bfile ); pos += 4;
        if ( node->length < (pos + 2) ) break;
        data->reserved6 = bf_get_int16_be( bfile ); pos += 2;
        if ( node->length < (pos + 2) ) break;
        data->reserved7 = bf_get_int16_be( bfile ); pos += 2;
    } while ( FALSE );

    if ( node->length > pos )
        pos += bf_read( bfile, node->data + pos - 4 + NODE_DATA_PAD,
            node->length - pos );

    return TRUE;
}